

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O1

bool __thiscall gpu::Device::printInfo(Device *this)

{
  bool bVar1;
  DeviceInfo device_info;
  DeviceInfo local_130;
  
  bVar1 = this->supports_opencl;
  if (bVar1 == true) {
    ocl::DeviceInfo::DeviceInfo(&local_130);
    ocl::DeviceInfo::init(&local_130,(EVP_PKEY_CTX *)this->device_id_opencl);
    ocl::DeviceInfo::print(&local_130);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_130.extensions._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.platform_version._M_dataplus._M_p != &local_130.platform_version.field_2) {
      operator_delete(local_130.platform_version._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.driver_version._M_dataplus._M_p != &local_130.driver_version.field_2) {
      operator_delete(local_130.driver_version._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.vendor_name._M_dataplus._M_p != &local_130.vendor_name.field_2) {
      operator_delete(local_130.vendor_name._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.device_name._M_dataplus._M_p != &local_130.device_name.field_2) {
      operator_delete(local_130.device_name._M_dataplus._M_p);
    }
  }
  return bVar1;
}

Assistant:

bool Device::printInfo() const
{
#ifdef CUDA_SUPPORT
	if (supports_cuda) {
		return CUDAEnum::printInfo(device_id_cuda);
	}
#endif

	if (supports_opencl) {
		ocl::DeviceInfo device_info;
		device_info.init(device_id_opencl);
		device_info.print();
		return true;
	}

	return false;
}